

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

AddressParts *
gen_lea_modrm_0(AddressParts *__return_storage_ptr__,CPUX86State *env,DisasContext *s,int modrm)

{
  byte bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar7 = (uint)modrm >> 6 & 3;
  uVar10 = modrm & 7;
  uVar11 = s->rex_b | uVar10;
  uVar6 = 3;
  uVar8 = 0xffffffff;
  uVar5 = 0;
  if (uVar7 == 3) goto LAB_004e8076;
  if (s->aflag - MO_32 < 2) {
    if (uVar10 == 4) {
      bVar1 = x86_ldub_code(env,s);
      uVar9 = (uint)(bVar1 >> 6);
      uVar11 = bVar1 >> 3 & 7 | s->rex_x;
      uVar8 = 0xffffffff;
      if (uVar11 != 4) {
        uVar8 = uVar11;
      }
      uVar11 = bVar1 & 7 | s->rex_b;
    }
    else {
      uVar8 = 0xffffffff;
      uVar9 = 0;
    }
    if (uVar7 == 1) {
      uVar2 = x86_ldub_code(env,s);
      uVar5 = (ulong)(char)uVar2;
LAB_004e819c:
      if (uVar11 == 4) {
        uVar11 = 4;
        if ((long)s->popl_esp_hack != 0) {
          uVar5 = uVar5 + (long)s->popl_esp_hack;
        }
      }
    }
    else {
      if (uVar7 != 0) {
        uVar4 = x86_ldl_code(env,s);
        uVar5 = (ulong)(int)uVar4;
        goto LAB_004e819c;
      }
      if ((uVar11 & 7) != 5) {
        uVar5 = 0;
        goto LAB_004e819c;
      }
      uVar4 = x86_ldl_code(env,s);
      uVar5 = (ulong)(int)uVar4;
      uVar11 = 0xffffffff;
      if ((uVar10 != 4) && (s->code64 != 0)) {
        uVar5 = uVar5 + s->pc + (long)s->rip_offset;
        uVar11 = 0xfffffffe;
      }
    }
    uVar6 = (uVar11 & 0xfffffffe) == 4 ^ 3;
    uVar10 = uVar9;
    goto switchD_004e8251_caseD_0;
  }
  if (s->aflag != MO_16) {
    fprintf(_stderr,"%s:%d: tcg fatal error\n",
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/translate.c"
            ,0x913);
    abort();
  }
  uVar8 = 6;
  if (uVar7 != 1) {
    if (uVar7 == 0) {
      uVar5 = 0;
      if (uVar10 != 6) goto LAB_004e823c;
      uVar3 = x86_lduw_code(env,s);
      uVar5 = (ulong)uVar3;
      uVar11 = 0xffffffff;
      goto LAB_004e8292;
    }
    uVar3 = x86_lduw_code(env,s);
    uVar5 = (ulong)(short)uVar3;
LAB_004e823c:
    uVar6 = 3;
    uVar11 = uVar6;
    switch(uVar10) {
    case 0:
      goto switchD_004e8251_caseD_0;
    case 2:
      goto switchD_004e8251_caseD_2;
    case 3:
      goto switchD_004e8251_caseD_3;
    case 4:
      goto switchD_004e8251_caseD_4;
    case 5:
      goto switchD_004e8251_caseD_5;
    case 6:
      goto switchD_004e8251_caseD_6;
    case 7:
      goto switchD_004e8251_caseD_7;
    }
switchD_004e8251_caseD_1:
    uVar8 = 7;
LAB_004e8280:
    uVar6 = 3;
    uVar10 = 0;
    uVar11 = uVar6;
    goto switchD_004e8251_caseD_0;
  }
  uVar2 = x86_ldub_code(env,s);
  uVar5 = (ulong)(char)uVar2;
  uVar6 = 3;
  uVar11 = uVar6;
  switch(uVar10) {
  case 0:
    goto switchD_004e8251_caseD_0;
  case 1:
    goto switchD_004e8251_caseD_1;
  case 2:
switchD_004e8251_caseD_2:
    uVar6 = 2;
    uVar11 = 5;
    break;
  case 3:
switchD_004e8251_caseD_3:
    uVar6 = 2;
    uVar11 = 5;
    uVar8 = 7;
    break;
  case 4:
switchD_004e8251_caseD_4:
    uVar11 = 6;
    goto LAB_004e8292;
  case 5:
switchD_004e8251_caseD_5:
    uVar11 = 7;
LAB_004e8292:
    uVar8 = 0xffffffff;
    uVar10 = 0;
    uVar6 = 3;
    goto switchD_004e8251_caseD_0;
  case 6:
switchD_004e8251_caseD_6:
    uVar6 = 2;
    uVar11 = 5;
    uVar10 = 0;
    uVar8 = 0xffffffff;
    goto switchD_004e8251_caseD_0;
  case 7:
switchD_004e8251_caseD_7:
    uVar8 = 0xffffffff;
    goto LAB_004e8280;
  }
LAB_004e8076:
  uVar10 = 0;
switchD_004e8251_caseD_0:
  __return_storage_ptr__->def_seg = uVar6;
  __return_storage_ptr__->base = uVar11;
  __return_storage_ptr__->index = uVar8;
  __return_storage_ptr__->scale = uVar10;
  __return_storage_ptr__->disp = uVar5;
  return __return_storage_ptr__;
}

Assistant:

static AddressParts gen_lea_modrm_0(CPUX86State *env, DisasContext *s,
                                    int modrm)
{
    int def_seg, base, index, scale, mod, rm;
    target_long disp;
    bool havesib;

    def_seg = R_DS;
    index = -1;
    scale = 0;
    disp = 0;

    mod = (modrm >> 6) & 3;
    rm = modrm & 7;
    base = rm | REX_B(s);

    if (mod == 3) {
        /* Normally filtered out earlier, but including this path
           simplifies multi-byte nop, as well as bndcl, bndcu, bndcn.  */
        goto done;
    }

    switch (s->aflag) {
    case MO_64:
    case MO_32:
        havesib = 0;
        if (rm == 4) {
            int code = x86_ldub_code(env, s);
            scale = (code >> 6) & 3;
            index = ((code >> 3) & 7) | REX_X(s);
            if (index == 4) {
                index = -1;  /* no index */
            }
            base = (code & 7) | REX_B(s);
            havesib = 1;
        }

        switch (mod) {
        case 0:
            if ((base & 7) == 5) {
                base = -1;
                disp = (int32_t)x86_ldl_code(env, s);
                if (CODE64(s) && !havesib) {
                    base = -2;
                    disp += s->pc + s->rip_offset;
                }
            }
            break;
        case 1:
            disp = (int8_t)x86_ldub_code(env, s);
            break;
        default:
        case 2:
            disp = (int32_t)x86_ldl_code(env, s);
            break;
        }

        /* For correct popl handling with esp.  */
        if (base == R_ESP && s->popl_esp_hack) {
            disp += s->popl_esp_hack;
        }
        if (base == R_EBP || base == R_ESP) {
            def_seg = R_SS;
        }
        break;

    case MO_16:
        if (mod == 0) {
            if (rm == 6) {
                base = -1;
                disp = x86_lduw_code(env, s);
                break;
            }
        } else if (mod == 1) {
            disp = (int8_t)x86_ldub_code(env, s);
        } else {
            disp = (int16_t)x86_lduw_code(env, s);
        }

        switch (rm) {
        case 0:
            base = R_EBX;
            index = R_ESI;
            break;
        case 1:
            base = R_EBX;
            index = R_EDI;
            break;
        case 2:
            base = R_EBP;
            index = R_ESI;
            def_seg = R_SS;
            break;
        case 3:
            base = R_EBP;
            index = R_EDI;
            def_seg = R_SS;
            break;
        case 4:
            base = R_ESI;
            break;
        case 5:
            base = R_EDI;
            break;
        case 6:
            base = R_EBP;
            def_seg = R_SS;
            break;
        default:
        case 7:
            base = R_EBX;
            break;
        }
        break;

    default:
        tcg_abort();
    }

 done:
    return (AddressParts){ def_seg, base, index, scale, disp };
}